

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O0

tlog * __thiscall
tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (tlog *this,duration<long,_std::ratio<1L,_1000000L>_> dur)

{
  duration<long,_std::ratio<1L,_1000000L>_> *pdVar1;
  rep rVar2;
  __cxx11 local_3e0 [32];
  __cxx11 local_3c0 [32];
  tlog local_3a0 [32];
  __cxx11 local_380 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  __cxx11 local_320 [32];
  tlog local_300 [32];
  __cxx11 local_2e0 [32];
  tlog local_2c0 [32];
  __cxx11 local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  __cxx11 local_200 [32];
  tlog local_1e0 [32];
  __cxx11 local_1c0 [32];
  tlog local_1a0 [32];
  __cxx11 local_180 [32];
  tlog local_160 [48];
  __cxx11 local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  duration<long,_std::ratio<1L,_1000000L>_> local_50;
  duration<long,_std::ratio<1L,_1L>_> local_48;
  __enable_if_is_duration<std::chrono::duration<long>_> s;
  duration<long,_std::ratio<60L,_1L>_> local_38;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<60L>_>_> m;
  duration<long,_std::ratio<3600L,_1L>_> local_28;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<3600L>_>_> h;
  __enable_if_is_duration<std::chrono::duration<long_long,_std::ratio<86400L>_>_> d;
  duration<long,_std::ratio<1L,_1000000L>_> dur_local;
  
  d.__r = dur.__r;
  h.__r = (rep)std::chrono::
               duration_cast<std::chrono::duration<long_long,std::ratio<86400l,1l>>,long,std::ratio<1l,1000000l>>
                         ((duration<long,_std::ratio<1L,_1000000L>_> *)&d);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::
  duration<long_long,std::ratio<86400l,1l>,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&m,
             (duration<long_long,_std::ratio<86400L,_1L>_> *)&h);
  pdVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator-=
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)&d,
                      (duration<long,_std::ratio<1L,_1000000L>_> *)&m);
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<3600l,1l>>,long,std::ratio<1l,1000000l>>
                                (pdVar1);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&s,&local_28);
  pdVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator-=
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)&d,
                      (duration<long,_std::ratio<1L,_1000000L>_> *)&s);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000l>>
                                (pdVar1);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&local_50,&local_38);
  pdVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::operator-=
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)&d,&local_50);
  local_48.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000l>>
                                (pdVar1);
  rVar2 = std::chrono::duration<long_long,_std::ratio<86400L,_1L>_>::count
                    ((duration<long_long,_std::ratio<86400L,_1L>_> *)&h);
  if (rVar2 < 1) {
    rVar2 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_28);
    if (rVar2 < 1) {
      rVar2 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_38);
      if (rVar2 < 1) {
        rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_48);
        std::__cxx11::to_string(local_3e0,rVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char)local_3e0);
        std::__cxx11::string::~string((string *)local_3e0);
      }
      else {
        rVar2 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_38);
        std::__cxx11::to_string(local_380,rVar2);
        std::operator+(local_360,(char)local_380);
        rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_48);
        std::__cxx11::to_string(local_3c0,rVar2);
        padFromLeft(local_3a0,(string *)local_3c0,2,'0');
        std::operator+(local_340,local_360);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char)local_340);
        std::__cxx11::string::~string((string *)local_340);
        std::__cxx11::string::~string((string *)local_3a0);
        std::__cxx11::string::~string((string *)local_3c0);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::~string((string *)local_380);
      }
    }
    else {
      rVar2 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_28);
      std::__cxx11::to_string(local_2a0,rVar2);
      std::operator+(local_280,(char)local_2a0);
      rVar2 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_38);
      std::__cxx11::to_string(local_2e0,rVar2);
      padFromLeft(local_2c0,(string *)local_2e0,2,'0');
      std::operator+(local_260,local_280);
      std::operator+(local_240,(char)local_260);
      rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_48);
      std::__cxx11::to_string(local_320,rVar2);
      padFromLeft(local_300,(string *)local_320,2,'0');
      std::operator+(local_220,local_240);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char)local_220);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)local_320);
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::~string((string *)local_2e0);
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::string::~string((string *)local_2a0);
    }
  }
  else {
    rVar2 = std::chrono::duration<long_long,_std::ratio<86400L,_1L>_>::count
                      ((duration<long_long,_std::ratio<86400L,_1L>_> *)&h);
    std::__cxx11::to_string(local_130,rVar2);
    std::operator+(local_110,(char)local_130);
    rVar2 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_28);
    std::__cxx11::to_string(local_180,rVar2);
    padFromLeft(local_160,(string *)local_180,2,'0');
    std::operator+(local_f0,local_110);
    std::operator+(local_d0,(char)local_f0);
    rVar2 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_38);
    std::__cxx11::to_string(local_1c0,rVar2);
    padFromLeft(local_1a0,(string *)local_1c0,2,'0');
    std::operator+(local_b0,local_d0);
    std::operator+(local_90,(char)local_b0);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_48);
    std::__cxx11::to_string(local_200,rVar2);
    padFromLeft(local_1e0,(string *)local_200,2,'0');
    std::operator+(local_70,local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_130);
  }
  return this;
}

Assistant:

std::string durationToString(T dur) {
        using namespace std::chrono;
        using day_t = duration<long long, std::ratio<3600 * 24>>;

        auto d = duration_cast<day_t>(dur);
        auto h = duration_cast<hours>(dur -= d);
        auto m = duration_cast<minutes>(dur -= h);
        auto s = duration_cast<seconds>(dur -= m);

        if (d.count() > 0) {
            return
                std::to_string(d.count()) + 'd' +
                padFromLeft(std::to_string(h.count()), 2, '0') + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (h.count() > 0) {
            return
                std::to_string(h.count()) + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (m.count() > 0) {
            return
                std::to_string(m.count()) + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else {
            return std::to_string(s.count()) + 's';
        }
    }